

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::BufferedOutputStream_&>
kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream,kj::OutputStream>(OutputStream *from)

{
  Maybe<kj::BufferedOutputStream_&> MVar1;
  
  MVar1.ptr = (BufferedOutputStream *)
              __dynamic_cast(from,&OutputStream::typeinfo,&BufferedOutputStream::typeinfo,0);
  return (Maybe<kj::BufferedOutputStream_&>)MVar1.ptr;
}

Assistant:

Maybe<To&> dynamicDowncastIfAvailable(From& from) {
  // If RTTI is disabled, always returns nullptr.  Otherwise, works like dynamic_cast.  Useful
  // in situations where dynamic_cast could allow an optimization, but isn't strictly necessary
  // for correctness.  It is highly recommended that you try to arrange all your dynamic_casts
  // this way, as a dynamic_cast that is necessary for correctness implies a flaw in the interface
  // design.

  // Force a compile error if To is not a subtype of From.  Cross-casting is rare; if it is needed
  // we should have a separate cast function like dynamicCrosscastIfAvailable().
  if (false) {
    kj::implicitCast<From*>(kj::implicitCast<To*>(nullptr));
  }

#if KJ_NO_RTTI
  return nullptr;
#else
  return dynamic_cast<To*>(&from);
#endif
}